

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QMainWindowLayout::setCurrentHoveredFloat(QMainWindowLayout *this,QDockWidgetGroupWindow *w)

{
  QWeakPointer<QObject> *this_00;
  bool bVar1;
  QDockWidgetGroupWindow *pQVar2;
  Object *sender;
  Object *sender_00;
  long in_FS_OFFSET;
  code *local_50;
  undefined8 local_48;
  Object local_40 [8];
  QWidgetData *local_38;
  
  local_38 = *(QWidgetData **)(in_FS_OFFSET + 0x28);
  if ((*(long *)(this + 0x7f0) == 0) || (*(int *)(*(long *)(this + 0x7f0) + 4) == 0)) {
    pQVar2 = (QDockWidgetGroupWindow *)0x0;
  }
  else {
    pQVar2 = *(QDockWidgetGroupWindow **)(this + 0x7f8);
  }
  if (pQVar2 != w) {
    this_00 = (QWeakPointer<QObject> *)(this + 0x7f0);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar1) {
      if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
        sender = (Object *)0x0;
      }
      else {
        sender = *(Object **)(this + 0x7f8);
      }
      sender_00 = (Object *)0x0;
      QObject::disconnect<void(QObject::*)(QObject*),void(QMainWindowLayout::*)()>
                (sender,(offset_in_QObject_to_subr)QObject::destroyed,(Object *)0x0,
                 (offset_in_QMainWindowLayout_to_subr)this);
      if (*(long *)(this + 0x7f0) != 0) {
        if (*(int *)(*(long *)(this + 0x7f0) + 4) == 0) {
          sender_00 = (Object *)0x0;
        }
        else {
          sender_00 = *(Object **)(this + 0x7f8);
        }
      }
      QObject::disconnect<void(QDockWidgetGroupWindow::*)(),void(QMainWindowLayout::*)()>
                (sender_00,0x3fed56,(Object *)0x0,(offset_in_QMainWindowLayout_to_subr)this);
      bVar1 = QPointer::operator_cast_to_bool((QPointer *)this_00);
      if (bVar1) {
        QDockWidgetGroupWindow::restore(*(QDockWidgetGroupWindow **)(this + 0x7f8));
      }
    }
    else if (w != (QDockWidgetGroupWindow *)0x0) {
      restore(this,true);
    }
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)w);
    if (w != (QDockWidgetGroupWindow *)0x0) {
      local_50 = updateGapIndicator;
      local_48._0_1_ = (QPaintDevice)0x0;
      local_48._1_7_ = 0;
      QObject::connect<void(QObject::*)(QObject*),void(QMainWindowLayout::*)()>
                (local_40,(offset_in_QObject_to_subr)w,(ContextType *)QObject::destroyed,
                 (offset_in_QMainWindowLayout_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)local_40);
      local_50 = updateGapIndicator;
      local_48._0_1_ = (QPaintDevice)0x0;
      local_48._1_7_ = 0;
      QObject::connect<void(QDockWidgetGroupWindow::*)(),void(QMainWindowLayout::*)()>
                ((Object *)&stack0xffffffffffffffa8,(offset_in_QDockWidgetGroupWindow_to_subr)w,
                 (ContextType *)QDockWidgetGroupWindow::resized,
                 (offset_in_QMainWindowLayout_to_subr *)0x0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffa8);
    }
    updateGapIndicator(this);
  }
  if (*(QWidgetData **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::setCurrentHoveredFloat(QDockWidgetGroupWindow *w)
{
    if (currentHoveredFloat != w) {
        if (currentHoveredFloat) {
            disconnect(currentHoveredFloat.data(), &QObject::destroyed,
                       this, &QMainWindowLayout::updateGapIndicator);
            disconnect(currentHoveredFloat.data(), &QDockWidgetGroupWindow::resized,
                       this, &QMainWindowLayout::updateGapIndicator);
            if (currentHoveredFloat)
                currentHoveredFloat->restore();
        } else if (w) {
            restore(true);
        }

        currentHoveredFloat = w;

        if (w) {
            connect(w, &QObject::destroyed,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
            connect(w, &QDockWidgetGroupWindow::resized,
                    this, &QMainWindowLayout::updateGapIndicator, Qt::UniqueConnection);
        }

        updateGapIndicator();
    }
}